

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_clear(secp256k1_gej *r)

{
  secp256k1_fe *in_RDI;
  
  *(undefined4 *)in_RDI[3].n = 0;
  secp256k1_fe_impl_clear(in_RDI);
  secp256k1_fe_impl_clear(in_RDI + 1);
  secp256k1_fe_impl_clear(in_RDI + 2);
  secp256k1_gej_verify((secp256k1_gej *)0x1107cc);
  return;
}

Assistant:

static void secp256k1_gej_clear(secp256k1_gej *r) {
    r->infinity = 0;
    secp256k1_fe_clear(&r->x);
    secp256k1_fe_clear(&r->y);
    secp256k1_fe_clear(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}